

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O0

LY_ERR ly_parse_int(char *val_str,size_t val_len,int64_t min,int64_t max,int base,int64_t *ret)

{
  char *__nptr;
  int *piVar1;
  longlong lVar2;
  ushort **ppuVar3;
  int64_t i;
  char *str;
  char *ptr;
  int64_t *piStack_40;
  LY_ERR rc;
  int64_t *ret_local;
  int64_t iStack_30;
  int base_local;
  int64_t max_local;
  int64_t min_local;
  size_t val_len_local;
  char *val_str_local;
  
  ptr._4_4_ = LY_SUCCESS;
  piStack_40 = ret;
  ret_local._4_4_ = base;
  iStack_30 = max;
  max_local = min;
  min_local = val_len;
  val_len_local = (size_t)val_str;
  if (val_str == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_str","ly_parse_int");
    val_str_local._4_4_ = LY_EINVAL;
  }
  else if (*val_str == '\0') {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_str[0]",
           "ly_parse_int");
    val_str_local._4_4_ = LY_EINVAL;
  }
  else if (val_len == 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val_len","ly_parse_int");
    val_str_local._4_4_ = LY_EINVAL;
  }
  else {
    __nptr = strndup(val_str,val_len);
    if (__nptr == (char *)0x0) {
      val_str_local._4_4_ = LY_EMEM;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0;
      lVar2 = strtoll(__nptr,&str,ret_local._4_4_);
      piVar1 = __errno_location();
      if ((*piVar1 == 0) && (str != __nptr)) {
        if ((lVar2 < max_local) || (iStack_30 < lVar2)) {
          ptr._4_4_ = LY_EDENIED;
        }
        else if (*str != '\0') {
          while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*str] & 0x2000) != 0) {
            str = str + 1;
          }
          if (*str != '\0') {
            ptr._4_4_ = LY_EVALID;
          }
        }
      }
      else {
        ptr._4_4_ = LY_EVALID;
      }
      free(__nptr);
      if (ptr._4_4_ == LY_SUCCESS) {
        *piStack_40 = lVar2;
      }
      val_str_local._4_4_ = ptr._4_4_;
    }
  }
  return val_str_local._4_4_;
}

Assistant:

LY_ERR
ly_parse_int(const char *val_str, size_t val_len, int64_t min, int64_t max, int base, int64_t *ret)
{
    LY_ERR rc = LY_SUCCESS;
    char *ptr, *str;
    int64_t i;

    LY_CHECK_ARG_RET(NULL, val_str, val_str[0], val_len, LY_EINVAL);

    /* duplicate the value */
    str = strndup(val_str, val_len);
    LY_CHECK_RET(!str, LY_EMEM);

    /* parse the value to avoid accessing following bytes */
    errno = 0;
    i = strtoll(str, &ptr, base);
    if (errno || (ptr == str)) {
        /* invalid string */
        rc = LY_EVALID;
    } else if ((i < min) || (i > max)) {
        /* invalid number */
        rc = LY_EDENIED;
    } else if (*ptr) {
        while (isspace(*ptr)) {
            ++ptr;
        }
        if (*ptr) {
            /* invalid characters after some number */
            rc = LY_EVALID;
        }
    }

    /* cleanup */
    free(str);
    if (!rc) {
        *ret = i;
    }
    return rc;
}